

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void add_token(VARR_token_t *to,token_t t)

{
  size_t sVar1;
  token_t ptVar2;
  token_t t_local;
  VARR_token_t *to_local;
  
  if ((((short)*(undefined4 *)t == 0x20) || ((short)*(undefined4 *)t == 10)) &&
     (sVar1 = VARR_token_tlength(to), sVar1 != 0)) {
    ptVar2 = VARR_token_tlast(to);
    if ((short)*(undefined4 *)ptVar2 == 0x20) {
      return;
    }
    ptVar2 = VARR_token_tlast(to);
    if ((short)*(undefined4 *)ptVar2 == 10) {
      return;
    }
  }
  VARR_token_tpush(to,t);
  return;
}

Assistant:

static void add_token (VARR (token_t) * to, token_t t) {
  if ((t->code != ' ' && t->code != '\n') || VARR_LENGTH (token_t, to) == 0
      || (VARR_LAST (token_t, to)->code != ' ' && VARR_LAST (token_t, to)->code != '\n'))
    VARR_PUSH (token_t, to, t);
}